

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype QtPrivate::lastIndexOf
                    (QLatin1StringView haystack,qsizetype from,QStringView needle,CaseSensitivity cs
                    )

{
  char32_t cVar1;
  int iVar2;
  qsizetype qVar3;
  anon_unknown_dwarf_bb6601 *paVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  anon_unknown_dwarf_bb6601 *paVar8;
  anon_unknown_dwarf_bb6601 *paVar9;
  anon_unknown_dwarf_bb6601 *paVar10;
  anon_unknown_dwarf_bb6601 *start;
  long lVar11;
  long lVar12;
  anon_unknown_dwarf_bb6601 *ch;
  ulong uVar13;
  bool bVar14;
  QLatin1StringView lhs;
  QLatin1String haystack_00;
  QLatin1StringView rhs;
  
  start = (anon_unknown_dwarf_bb6601 *)needle.m_data;
  uVar6 = needle.m_size;
  haystack_00.m_size = (anon_unknown_dwarf_bb6601 *)haystack.m_data;
  paVar10 = (anon_unknown_dwarf_bb6601 *)haystack.m_size;
  if (uVar6 == 1) {
    haystack_00.m_data._0_2_ = *(undefined2 *)start;
    haystack_00.m_data._2_6_ = 0;
    qVar3 = anon_unknown.dwarf_bb6601::qLastIndexOf<QLatin1String>
                      (paVar10,haystack_00,(QChar)(char16_t)from,(ulong)cs,cs);
    return qVar3;
  }
  paVar4 = (anon_unknown_dwarf_bb6601 *)((from >> 0x3f & (ulong)paVar10) + from);
  if (paVar4 != paVar10 || uVar6 != 0) {
    paVar8 = paVar10 + -uVar6;
    bVar14 = paVar4 <= paVar10;
    paVar10 = (anon_unknown_dwarf_bb6601 *)0xffffffffffffffff;
    if (-1 < (long)paVar8 && bVar14) {
      if ((long)paVar4 < (long)paVar8) {
        paVar8 = paVar4;
      }
      paVar10 = haystack_00.m_size + (long)paVar8;
      uVar7 = uVar6 - 1;
      if (uVar6 == 0) {
        uVar7 = 0;
      }
      paVar4 = start + uVar7 * 2;
      ch = paVar10 + uVar7;
      uVar13 = 0;
      if (0 < (long)uVar6) {
        uVar13 = uVar6;
      }
      if (cs == CaseSensitive) {
        lVar12 = 0;
        lVar11 = 0;
        for (lVar5 = 0; -lVar5 != uVar13; lVar5 = lVar5 + -1) {
          lVar11 = (ulong)(ushort)*(char16_t *)(paVar4 + lVar5 * 2) + lVar11 * 2;
          lVar12 = (ulong)(byte)ch[lVar5] + lVar12 * 2;
        }
        lVar12 = lVar12 - (ulong)(byte)*paVar10;
        for (; paVar10 = haystack_00.m_size + (long)paVar8, haystack_00.m_size <= paVar10;
            paVar8 = paVar8 + -1) {
          lVar12 = lVar12 + (ulong)(byte)*paVar10;
          if ((lVar12 == lVar11) &&
             (rhs.m_data = (char *)paVar10, rhs.m_size = uVar6,
             iVar2 = compareStrings(needle,rhs,CaseSensitive), iVar2 == 0)) {
            return (qsizetype)paVar8;
          }
          if (uVar7 < 0x40) {
            lVar12 = lVar12 - ((ulong)(byte)(haystack_00.m_size + (uVar6 - 1))[(long)paVar8] <<
                              ((byte)uVar7 & 0x3f));
          }
          lVar12 = lVar12 * 2;
        }
      }
      else {
        lVar12 = 0;
        lVar11 = 0;
        paVar9 = haystack_00.m_size;
        while (bVar14 = uVar13 != 0, uVar13 = uVar13 - 1, bVar14) {
          paVar9 = start;
          cVar1 = foldCase((char16_t *)paVar4,(char16_t *)start);
          lVar11 = (ulong)(uint)cVar1 + lVar11 * 2;
          cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>((char *)ch,(char *)paVar9);
          lVar12 = (ulong)(uint)cVar1 + lVar12 * 2;
          ch = ch + -1;
          paVar4 = paVar4 + 0xfffffffffffffffe;
        }
        cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>((char *)paVar10,(char *)paVar9);
        lVar12 = lVar12 - (ulong)(uint)cVar1;
        for (; paVar10 = haystack_00.m_size + (long)paVar8, haystack_00.m_size <= paVar10;
            paVar8 = paVar8 + -1) {
          cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>((char *)paVar10,(char *)paVar9)
          ;
          lVar12 = lVar12 + (ulong)(uint)cVar1;
          if ((lVar12 == lVar11) &&
             (lhs.m_data = (char *)paVar10, lhs.m_size = uVar6,
             iVar2 = compareStrings(lhs,needle,CaseInsensitive), paVar9 = paVar10, iVar2 == 0)) {
            return (qsizetype)paVar8;
          }
          if (uVar7 < 0x40) {
            cVar1 = (anonymous_namespace)::foldCaseHelper<char_const*>
                              ((char *)(haystack_00.m_size + uVar6 + (long)paVar8 + -1),
                               (char *)paVar9);
            lVar12 = lVar12 - ((ulong)(uint)cVar1 << ((byte)uVar7 & 0x3f));
          }
          lVar12 = lVar12 * 2;
        }
      }
      paVar10 = (anon_unknown_dwarf_bb6601 *)0xffffffffffffffff;
    }
  }
  return (qsizetype)paVar10;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QLatin1StringView haystack, qsizetype from, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}